

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderPrimitiveCounter::GeometryShaderPrimitiveCounter
          (GeometryShaderPrimitiveCounter *this,Context *context,ExtParameters *extParams,char *name
          ,char *description,DataPrimitiveIDInCounter *testConfiguration)

{
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderPrimitiveCounter_01df8d80;
  DataPrimitiveIDInCounter::DataPrimitiveIDInCounter(&this->m_testConfiguration,testConfiguration);
  this->m_nrVaryings = 0;
  this->m_sizeOfDataArray = 0;
  this->m_sizeOfFeedbackBuffer = 0;
  this->m_n_components = 4;
  this->m_maxGeometryOutputVertices = 0;
  this->m_fragment_shader_id = 0;
  this->m_geometry_shader_id = 0;
  this->m_vertex_shader_id = 0;
  this->m_program_id = 0;
  this->m_tbo = 0;
  this->m_vao = 0;
  this->m_vbo = 0;
  return;
}

Assistant:

GeometryShaderPrimitiveCounter::GeometryShaderPrimitiveCounter(Context& context, const ExtParameters& extParams,
															   const char* name, const char* description,
															   const DataPrimitiveIDInCounter& testConfiguration)
	: TestCaseBase(context, extParams, name, description)
	, m_testConfiguration(testConfiguration)
	, m_nrVaryings(0)
	, m_sizeOfDataArray(0)
	, m_sizeOfFeedbackBuffer(0)
	, m_n_components(4)
	, m_maxGeometryOutputVertices(0)
	, m_fragment_shader_id(0)
	, m_geometry_shader_id(0)
	, m_vertex_shader_id(0)
	, m_program_id(0)
	, m_tbo(0)
	, m_vao(0)
	, m_vbo(0)
{
	/* Left blank on purpose */
}